

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * __thiscall
ON_ManagedFonts::Internal_AddManagedFont
          (ON_ManagedFonts *this,ON_Font *managed_font,
          ON_FontMetrics *managed_font_metrics_in_font_design_units)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bPreferedItalic;
  Member MVar3;
  bool bVar4;
  ON_Font *pOVar5;
  element_type *__p;
  ON_MemoryAllocationTracking disable_tracking;
  ON_FontFaceQuartet default_quartet;
  ON_MemoryAllocationTracking local_80;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  ON_Font *local_68;
  ON_Font *pOStack_60;
  ON_Font *local_58;
  double dStack_50;
  double local_48;
  ON__UINT_PTR OStack_40;
  
  ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&local_80,false);
  if ((this->m_default_font_ptr == 0) && (managed_font->m_runtime_serial_number == 1)) {
    this->m_default_font_ptr = (ON__UINT_PTR)managed_font;
  }
  InstalledFonts();
  pOVar5 = ON_FontList::FromFontProperties(&List.m_installed_fonts,managed_font,true,true);
  if (pOVar5 == (ON_Font *)0x0) {
    bVar4 = ON_Font::IsBoldInQuartet(managed_font);
    bPreferedItalic = ON_Font::IsItalicInQuartet(managed_font);
    if (managed_font->m_quartet_member == Unset) {
      MVar3 = bPreferedItalic * '\x02' + Regular;
      if (bVar4) {
        MVar3 = bPreferedItalic * '\x02' + Bold;
      }
      managed_font->m_quartet_member = MVar3;
    }
    ON_Font::InstalledFontQuartet((ON_FontFaceQuartet *)local_78,&ON_Font::Default);
    pOVar5 = ON_FontFaceQuartet::ClosestFace((ON_FontFaceQuartet *)local_78,bVar4,bPreferedItalic);
    if (pOVar5 == (ON_Font *)0x0) {
      pOVar5 = &ON_Font::Default;
    }
    managed_font->m_managed_installed_font_and_bits = (ulong)pOVar5 | 2;
    ON_wString::~ON_wString((ON_wString *)local_78);
  }
  else {
    managed_font->m_managed_installed_font_and_bits = (ulong)pOVar5 | 1;
  }
  __p = (managed_font->m_font_glyph_cache).
        super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__p == (element_type *)0x0) {
    __p = ON_FontGlyphCache::New();
    local_78 = (undefined1  [8])__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ON_FontGlyphCache*>
              (&_Stack_70,__p);
    _Var2._M_pi = _Stack_70._M_pi;
    auVar1 = local_78;
    local_78 = (undefined1  [8])0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (managed_font->m_font_glyph_cache).
              super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (managed_font->m_font_glyph_cache).
    super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar1;
    (managed_font->m_font_glyph_cache).
    super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if ((ON_Font *)_Stack_70._M_pi != (ON_Font *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
    }
  }
  bVar4 = ON_FontMetrics::HeightsAreValid(&__p->m_font_unit_metrics);
  if (bVar4) goto LAB_00473d36;
  local_48 = 0.0;
  OStack_40 = 0;
  local_58 = (ON_Font *)0x0;
  dStack_50 = 0.0;
  local_68 = (ON_Font *)0x0;
  pOStack_60 = (ON_Font *)0x0;
  local_78 = (undefined1  [8])0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (managed_font_metrics_in_font_design_units == (ON_FontMetrics *)0x0) {
LAB_00473d1c:
    GetFontMetricsInFontDesignUnits(managed_font,(ON_FontMetrics *)local_78);
  }
  else {
    bVar4 = ON_FontMetrics::HeightsAreValid(managed_font_metrics_in_font_design_units);
    if (!bVar4) goto LAB_00473d1c;
    local_78 = *(undefined1 (*) [8])managed_font_metrics_in_font_design_units;
    _Stack_70._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          &managed_font_metrics_in_font_design_units->m_descent;
    local_68 = *(ON_Font **)&managed_font_metrics_in_font_design_units->m_ascent_of_capital;
    pOStack_60 = *(ON_Font **)&managed_font_metrics_in_font_design_units->m_strikeout_position;
    local_58 = *(ON_Font **)&managed_font_metrics_in_font_design_units->m_underscore_position;
    dStack_50 = managed_font_metrics_in_font_design_units->m_reserved2;
    local_48 = managed_font_metrics_in_font_design_units->m_reserved3;
    OStack_40 = managed_font_metrics_in_font_design_units->m_reserved_ptr;
  }
  ON_FontGlyphCache::SetFontMetrics(__p,(ON_FontMetrics *)local_78);
LAB_00473d36:
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_locale_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_postscript_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_postscript_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_family_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_family_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_face_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_en_face_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_windows_logfont_name);
  Internal_AddManagedFontSingleRefCountString(&managed_font->m_loc_windows_logfont_name);
  ON_FontList::AddFont(&this->m_managed_fonts,managed_font,false);
  ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&local_80);
  return managed_font;
}

Assistant:

const ON_Font* ON_ManagedFonts::Internal_AddManagedFont(
  const ON_Font* managed_font,
  const ON_FontMetrics* managed_font_metrics_in_font_design_units
  )
{
  // All memory allocated for managed fonts is permanent app workspace memory.
  ON_MemoryAllocationTracking disable_tracking(false);

  if (0 == m_default_font_ptr && 1 == managed_font->m_runtime_serial_number)
  {
    // ON_Font::Default is constructed after ON_ManagedFonts::List and
    // destroyed before ON_ManagedFonts::List. Therefore ~ON_ManagedFonts()
    // has a pointer to ON_Font::Default that must be ignored during
    // destruction.
    m_default_font_ptr = (ON__UINT_PTR)managed_font;
  }

  const ON_Font* installed_font = InstalledFonts().FromFontProperties(managed_font, true, true);
  if (nullptr != installed_font)
  {
    // This managed font matches an installed font.
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font, installed_font, false);
  }
  else
  {
    // Feb 22, 2021 RH-62974
    // This managed font is not installed on this device.
    // After prototyping several approaches permitting various types
    // of user configured font substitution, Lowell and Dale Lear
    // concluded that using the default font was the best option.
    // If this is a problem for lots of users, then we need a way
    // for users to configure the choice of default font.
    // Current settings:
    // Windows: Arial
    // Apple: Helvetic Neue

    // managed_font is a missing font.
    // We have to substitute the correct quartet member (regular/bold/italic/bold-italic).
    // Since managed_font references a font that is not installed on this device,
    // IsItalicInQuartet() and IsBoldInQuartet() will probably fall through to
    // the fallback best guess sections of those functions.
    const bool bBoldInQuartet = managed_font->IsBoldInQuartet();
    const bool bItalicInQuartet = managed_font->IsItalicInQuartet();
    if (ON_FontFaceQuartet::Member::Unset == managed_font->m_quartet_member)
      managed_font->m_quartet_member = ON_FontFaceQuartet::MemberFromBoldAndItalic(bBoldInQuartet, bItalicInQuartet);

    const ON_FontFaceQuartet default_quartet = ON_Font::Default.InstalledFontQuartet(); // only look at installed quartet!
    installed_font = default_quartet.ClosestFace(bBoldInQuartet, bItalicInQuartet);
    if (nullptr == installed_font)
      installed_font = &ON_Font::Default;
    ON_Font::Internal_SetManagedFontInstalledFont(managed_font, installed_font, true);
  }

  ON_FontGlyphCache* font_cache = managed_font->m_font_glyph_cache.get();
  if (nullptr == font_cache)
  {
    /////////////////////
    //
    // Put the cached glyph information here so we only have one set for each font
    //
    font_cache = ON_FontGlyphCache::New();
    managed_font->m_font_glyph_cache = std::shared_ptr<ON_FontGlyphCache>(font_cache);
  }

  if (nullptr != font_cache)
  {
    if (false == font_cache->m_font_unit_metrics.HeightsAreValid())
    {
      ON_FontMetrics font_metrics_in_font_design_units;

      if (
        nullptr != managed_font_metrics_in_font_design_units
        && managed_font_metrics_in_font_design_units->HeightsAreValid()
        )
      {
        font_metrics_in_font_design_units = *managed_font_metrics_in_font_design_units;
      }
      else
      {
        ON_ManagedFonts::GetFontMetricsInFontDesignUnits(
          managed_font,
          font_metrics_in_font_design_units
        );
      }

      font_cache->SetFontMetrics(font_metrics_in_font_design_units);
    }
  }
  
  // Insulate strings in managed fonts from outside damage.
  Internal_AddManagedFontSingleRefCountString(managed_font->m_locale_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_postscript_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_postscript_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_family_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_family_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_face_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_en_face_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_windows_logfont_name);
  Internal_AddManagedFontSingleRefCountString(managed_font->m_loc_windows_logfont_name);

  m_managed_fonts.AddFont(managed_font,false);

  return managed_font;
}